

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O1

int __thiscall
cmCPackIFWPackage::ConfigureFromComponent(cmCPackIFWPackage *this,cmCPackComponent *component)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  pointer pcVar1;
  cmCPackIFWGenerator *pcVar2;
  cmCPackLog *pcVar3;
  _Alloc_hider _Var4;
  bool bVar5;
  int iVar6;
  long *plVar7;
  mapped_type *pmVar8;
  char *pcVar9;
  size_t sVar10;
  mapped_type *__v;
  ostream *poVar11;
  size_type *psVar12;
  iterator dit;
  pointer __k;
  char *pcVar13;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_1e8;
  string local_1c8;
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  if (component == (cmCPackComponent *)0x0) {
    iVar6 = 0;
  }
  else {
    DefaultConfiguration(this);
    cmsys::SystemTools::UpperCase(&local_1c8,&component->Name);
    plVar7 = (long *)std::__cxx11::string::replace((ulong)&local_1c8,0,(char *)0x0,0x5b6d19);
    pcVar1 = local_1a8 + 0x10;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar12) {
      local_1a8._16_8_ = *psVar12;
      local_1a8._24_8_ = plVar7[3];
      local_1a8._0_8_ = pcVar1;
    }
    else {
      local_1a8._16_8_ = *psVar12;
      local_1a8._0_8_ = (size_type *)*plVar7;
    }
    local_1a8._8_8_ = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    plVar7 = (long *)std::__cxx11::string::append(local_1a8);
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    psVar12 = (size_type *)(plVar7 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar7 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar12) {
      local_1e8.field_2._M_allocated_capacity = *psVar12;
      local_1e8.field_2._8_8_ = plVar7[3];
    }
    else {
      local_1e8.field_2._M_allocated_capacity = *psVar12;
      local_1e8._M_dataplus._M_p = (pointer)*plVar7;
    }
    local_1e8._M_string_length = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
      operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->DisplayName,(key_type *)local_1a8);
    std::__cxx11::string::_M_assign((string *)pmVar8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,"");
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&this->Description,(key_type *)local_1a8);
    std::__cxx11::string::_M_assign((string *)pmVar8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1e8._M_dataplus._M_p,
               local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
    std::__cxx11::string::append(local_1a8);
    pcVar9 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (pcVar9 == (char *)0x0) {
      local_1a8._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1a8,"CPACK_PACKAGE_VERSION","");
      pcVar9 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      pcVar13 = (char *)(this->Version)._M_string_length;
      if (pcVar9 == (char *)0x0) {
        pcVar9 = "1.0.0";
      }
      else {
        strlen(pcVar9);
      }
      std::__cxx11::string::_M_replace((ulong)&this->Version,0,pcVar13,(ulong)pcVar9);
    }
    else {
      pcVar13 = (char *)(this->Version)._M_string_length;
      strlen(pcVar9);
      std::__cxx11::string::_M_replace((ulong)&this->Version,0,pcVar13,(ulong)pcVar9);
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1e8._M_dataplus._M_p,
               local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
    std::__cxx11::string::append(local_1a8);
    pcVar9 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (pcVar9 != (char *)0x0) {
      pcVar13 = (char *)(this->Script)._M_string_length;
      strlen(pcVar9);
      std::__cxx11::string::_M_replace((ulong)&this->Script,0,pcVar13,(ulong)pcVar9);
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1e8._M_dataplus._M_p,
               local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
    std::__cxx11::string::append(local_1a8);
    pcVar9 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (pcVar9 != (char *)0x0) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&this->UserInterfaces,
                        (this->UserInterfaces).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
      local_1a8._0_8_ = pcVar1;
      sVar10 = strlen(pcVar9);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar9,pcVar9 + sVar10);
      cmSystemTools::ExpandListArgument((string *)local_1a8,&this->UserInterfaces,false);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
    }
    __k = (component->Dependencies).
          super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
          super__Vector_impl_data._M_start;
    if ((__k != (component->Dependencies).
                super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
                super__Vector_impl_data._M_finish) &&
       (__k != (component->Dependencies).
               super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>._M_impl.
               super__Vector_impl_data._M_finish)) {
      do {
        __v = std::
              map<cmCPackComponent_*,_cmCPackIFWPackage_*,_std::less<cmCPackComponent_*>,_std::allocator<std::pair<cmCPackComponent_*const,_cmCPackIFWPackage_*>_>_>
              ::operator[](&((this->super_cmCPackIFWCommon).Generator)->ComponentPackages,__k);
        std::
        _Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
        ::_M_insert_unique<cmCPackIFWPackage*const&>
                  ((_Rb_tree<cmCPackIFWPackage*,cmCPackIFWPackage*,std::_Identity<cmCPackIFWPackage*>,std::less<cmCPackIFWPackage*>,std::allocator<cmCPackIFWPackage*>>
                    *)&this->Dependencies,__v);
        __k = __k + 1;
      } while (__k != (component->Dependencies).
                      super__Vector_base<cmCPackComponent_*,_std::allocator<cmCPackComponent_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish);
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1e8._M_dataplus._M_p,
               local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
    std::__cxx11::string::append(local_1a8);
    pcVar9 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (pcVar9 != (char *)0x0) {
      this_00 = &this->Licenses;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(this_00,(this->Licenses).
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
      local_1a8._0_8_ = pcVar1;
      sVar10 = strlen(pcVar9);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1a8,pcVar9,pcVar9 + sVar10);
      cmSystemTools::ExpandListArgument((string *)local_1a8,this_00,false);
      if ((pointer)local_1a8._0_8_ != pcVar1) {
        operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
      }
      if ((*(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
           *(int *)&(this->Licenses).
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start & 0x20U) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,local_1e8._M_dataplus._M_p,
                             local_1e8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar11,"LICENSES",8);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar11," should contain pairs of <display_name> and <file_path>.",0x38);
        std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
        std::ostream::put((char)poVar11);
        std::ostream::flush();
        pcVar2 = (this->super_cmCPackIFWCommon).Generator;
        if (pcVar2 != (cmCPackIFWGenerator *)0x0) {
          pcVar3 = (pcVar2->super_cmCPackGenerator).Logger;
          std::__cxx11::stringbuf::str();
          _Var4._M_p = local_1c8._M_dataplus._M_p;
          sVar10 = strlen(local_1c8._M_dataplus._M_p);
          cmCPackLog::Log(pcVar3,8,
                          "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                          ,0xde,_Var4._M_p,sVar10);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::_M_erase_at_end(this_00,(this_00->
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  )._M_impl.super__Vector_impl_data._M_start);
      }
    }
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1e8._M_dataplus._M_p,
               local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
    std::__cxx11::string::append(local_1a8);
    pcVar9 = cmCPackIFWCommon::GetOption(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (pcVar9 != (char *)0x0) {
      pcVar13 = (char *)(this->SortingPriority)._M_string_length;
      strlen(pcVar9);
      std::__cxx11::string::_M_replace((ulong)&this->SortingPriority,0,pcVar13,(ulong)pcVar9);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"The \"PRIORITY\" option is set ",0x1d);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"for component \"",0xf);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_1a8,(component->Name)._M_dataplus._M_p,
                           (component->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11,"\", but there option is ",0x17);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,"deprecated. Please use \"SORTING_PRIORITY\" option instead.",0x39);
      std::ios::widen((char)poVar11->_vptr_basic_ostream[-3] + (char)poVar11);
      std::ostream::put((char)poVar11);
      std::ostream::flush();
      pcVar2 = (this->super_cmCPackIFWCommon).Generator;
      if (pcVar2 != (cmCPackIFWGenerator *)0x0) {
        pcVar3 = (pcVar2->super_cmCPackGenerator).Logger;
        std::__cxx11::stringbuf::str();
        _Var4._M_p = local_1c8._M_dataplus._M_p;
        sVar10 = strlen(local_1c8._M_dataplus._M_p);
        cmCPackLog::Log(pcVar3,8,
                        "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                        ,0xea,_Var4._M_p,sVar10);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
    }
    pcVar13 = "false";
    pcVar9 = "false";
    if ((component->field_0x48 & 4) == 0) {
      pcVar9 = "true";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->Default,0,(char *)(this->Default)._M_string_length,(ulong)pcVar9);
    local_1a8._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a8,local_1e8._M_dataplus._M_p,
               local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
    std::__cxx11::string::append(local_1a8);
    bVar5 = cmCPackIFWCommon::IsOn(&this->super_cmCPackIFWCommon,(string *)local_1a8);
    if ((pointer)local_1a8._0_8_ != pcVar1) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (bVar5) {
      std::__cxx11::string::_M_replace
                ((ulong)&this->Essential,0,(char *)(this->Essential)._M_string_length,0x5d45ff);
    }
    pcVar9 = "PK\x01\x02";
    if ((component->field_0x48 & 2) != 0) {
      pcVar9 = " || true";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->Virtual,0,(char *)(this->Virtual)._M_string_length,(ulong)(pcVar9 + 4))
    ;
    if ((component->field_0x48 & 1) != 0) {
      pcVar13 = "true";
    }
    std::__cxx11::string::_M_replace
              ((ulong)&this->ForcedInstallation,0,
               (char *)(this->ForcedInstallation)._M_string_length,(ulong)pcVar13);
    ConfigureFromPrefix(this,&local_1e8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

int cmCPackIFWPackage::ConfigureFromComponent(cmCPackComponent* component)
{
  if (!component) {
    return 0;
  }

  // Restore defaul configuration
  this->DefaultConfiguration();

  std::string prefix = "CPACK_IFW_COMPONENT_" +
    cmsys::SystemTools::UpperCase(component->Name) + "_";

  // Display name
  this->DisplayName[""] = component->DisplayName;

  // Description
  this->Description[""] = component->Description;

  // Version
  if (const char* optVERSION = this->GetOption(prefix + "VERSION")) {
    this->Version = optVERSION;
  } else if (const char* optPACKAGE_VERSION =
               this->GetOption("CPACK_PACKAGE_VERSION")) {
    this->Version = optPACKAGE_VERSION;
  } else {
    this->Version = "1.0.0";
  }

  // Script
  if (const char* option = this->GetOption(prefix + "SCRIPT")) {
    this->Script = option;
  }

  // User interfaces
  if (const char* option = this->GetOption(prefix + "USER_INTERFACES")) {
    this->UserInterfaces.clear();
    cmSystemTools::ExpandListArgument(option, this->UserInterfaces);
  }

  // CMake dependencies
  if (!component->Dependencies.empty()) {
    std::vector<cmCPackComponent*>::iterator dit;
    for (dit = component->Dependencies.begin();
         dit != component->Dependencies.end(); ++dit) {
      this->Dependencies.insert(this->Generator->ComponentPackages[*dit]);
    }
  }

  // Licenses
  if (const char* option = this->GetOption(prefix + "LICENSES")) {
    this->Licenses.clear();
    cmSystemTools::ExpandListArgument(option, this->Licenses);
    if (this->Licenses.size() % 2 != 0) {
      cmCPackIFWLogger(
        WARNING,
        prefix << "LICENSES"
               << " should contain pairs of <display_name> and <file_path>."
               << std::endl);
      this->Licenses.clear();
    }
  }

  // Priority
  if (const char* option = this->GetOption(prefix + "PRIORITY")) {
    this->SortingPriority = option;
    cmCPackIFWLogger(
      WARNING, "The \"PRIORITY\" option is set "
        << "for component \"" << component->Name << "\", but there option is "
        << "deprecated. Please use \"SORTING_PRIORITY\" option instead."
        << std::endl);
  }

  // Default
  this->Default = component->IsDisabledByDefault ? "false" : "true";

  // Essential
  if (this->IsOn(prefix + "ESSENTIAL")) {
    this->Essential = "true";
  }

  // Virtual
  this->Virtual = component->IsHidden ? "true" : "";

  // ForcedInstallation
  this->ForcedInstallation = component->IsRequired ? "true" : "false";

  return this->ConfigureFromPrefix(prefix);
}